

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::mipmapped_texture::qdxt_pack_init
          (mipmapped_texture *this,qdxt_state *state,mipmapped_texture *dst_tex,
          qdxt1_params *dxt1_params,qdxt5_params *dxt5_params,pixel_format fmt,bool cook)

{
  bool bVar1;
  bool bVar2;
  pixel_format pVar3;
  mip_level *this_00;
  dxt_pixel_block *pdVar4;
  uint uVar5;
  conversion_type conv_type;
  int iVar6;
  ulong uVar7;
  image_u8 *other;
  color_quad_u8 *pcVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  uint *puVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  color_quad_u8 *pcVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  image_u8 img;
  image_u8 tmp_img;
  
  if ((this->m_faces).m_size == 0) {
    return false;
  }
  memcpy(&state->m_qdxt1_params,dxt1_params,0x630);
  memcpy(state->m_qdxt5_params,dxt5_params,0x62d);
  memcpy(state->m_qdxt5_params + 1,dxt5_params,0x62d);
  state->m_has_blocks[0] = false;
  state->m_has_blocks[1] = false;
  state->m_has_blocks[2] = false;
  if ((int)fmt < 0x41325445) {
    if ((int)fmt < 0x32495441) {
      if (0x31545843 < (int)fmt) {
        if (fmt != PIXEL_FMT_DXT1) {
          if (fmt != PIXEL_FMT_ETC2) {
            return false;
          }
          goto LAB_0013245d;
        }
        state->m_has_blocks[0] = true;
        goto LAB_001324f8;
      }
      if (fmt == PIXEL_FMT_ETC1) {
LAB_0013245d:
        console::warning("mipmapped_texture::qdxt_pack_init: This method does not support ETCn");
        return false;
      }
      if (fmt != PIXEL_FMT_DXT5A) {
        return false;
      }
      state->m_has_blocks[1] = true;
      goto LAB_001324ee;
    }
    if ((int)fmt < 0x35545844) {
      if (fmt != PIXEL_FMT_3DC) {
        if (fmt != PIXEL_FMT_DXT4) {
          return false;
        }
LAB_001324de:
        state->m_has_blocks[0] = true;
        state->m_has_blocks[1] = true;
        (state->m_qdxt1_params).m_use_alpha_blocks = false;
        goto LAB_001324ee;
      }
      state->m_has_blocks[1] = true;
      state->m_has_blocks[2] = true;
      state->m_qdxt5_params[0].m_comp_index = 1;
      state->m_qdxt5_params[1].m_comp_index = 0;
    }
    else {
      if (fmt == PIXEL_FMT_DXT5) goto LAB_001324de;
      if (fmt != PIXEL_FMT_DXT1A) {
        return false;
      }
      state->m_has_blocks[0] = true;
      (state->m_qdxt1_params).m_use_alpha_blocks = true;
    }
  }
  else {
    if ((int)fmt < 0x53315445) {
      if ((int)fmt < 0x52424778) {
        if (fmt == PIXEL_FMT_ETC2A) goto LAB_0013245d;
        if (fmt != PIXEL_FMT_DXT5_AGBR) {
          return false;
        }
      }
      else if ((fmt != PIXEL_FMT_DXT5_xGBR) && (fmt != PIXEL_FMT_DXT5_xGxR)) {
        return false;
      }
    }
    else {
      if ((int)fmt < 0x59583241) {
        if ((fmt != PIXEL_FMT_ETC1S) && (fmt != PIXEL_FMT_ETC2AS)) {
          return false;
        }
        goto LAB_0013245d;
      }
      if (fmt == PIXEL_FMT_DXN) {
        state->m_has_blocks[1] = true;
        state->m_has_blocks[2] = true;
        state->m_qdxt5_params[0].m_comp_index = 0;
        state->m_qdxt5_params[1].m_comp_index = 1;
        goto LAB_001324f8;
      }
      if (fmt != PIXEL_FMT_DXT5_CCxY) {
        return false;
      }
    }
    state->m_has_blocks[0] = true;
    state->m_has_blocks[1] = true;
    (state->m_qdxt1_params).m_perceptual = false;
    (state->m_qdxt1_params).m_use_alpha_blocks = false;
LAB_001324ee:
    state->m_qdxt5_params[0].m_comp_index = 3;
  }
LAB_001324f8:
  bVar1 = state->m_has_blocks[1];
  bVar2 = state->m_has_blocks[2];
  bVar9 = bVar1 + state->m_has_blocks[0] + bVar2;
  uVar10 = dxt1_params->m_progress_start;
  if (state->m_has_blocks[0] == true) {
    (state->m_qdxt1_params).m_progress_start = uVar10;
    uVar5 = dxt1_params->m_progress_range / (uint)bVar9;
    (state->m_qdxt1_params).m_progress_range = uVar5;
    uVar10 = uVar10 + uVar5;
  }
  if (bVar1 != false) {
    state->m_qdxt5_params[0].m_progress_start = uVar10;
    uVar5 = dxt1_params->m_progress_range / (uint)bVar9;
    state->m_qdxt5_params[0].m_progress_range = uVar5;
    uVar10 = uVar10 + uVar5;
  }
  if (bVar2 != false) {
    state->m_qdxt5_params[1].m_progress_start = uVar10;
    state->m_qdxt5_params[1].m_progress_range = dxt1_params->m_progress_range - uVar10;
  }
  state->m_fmt = fmt;
  init(dst_tex,(EVP_PKEY_CTX *)(ulong)this->m_width);
  if ((state->m_pixel_blocks).m_size != 0) {
    (state->m_pixel_blocks).m_size = 0;
  }
  conv_type = cConversion_Invalid;
  if ((!cook) ||
     ((conv_type = image_utils::get_conversion_type(true,fmt), fmt != PIXEL_FMT_A8 &&
      (fmt != PIXEL_FMT_DXT5A)))) goto LAB_001326fa;
  pVar3 = this->m_format;
  if ((int)pVar3 < 0x41325445) {
    if ((int)pVar3 < 0x34545844) {
      if (((pVar3 == PIXEL_FMT_DXT5A) || (pVar3 == PIXEL_FMT_DXT2)) || (pVar3 == PIXEL_FMT_DXT3))
      goto LAB_001326fa;
    }
    else if (((pVar3 == PIXEL_FMT_DXT4) || (pVar3 == PIXEL_FMT_DXT5)) || (pVar3 == PIXEL_FMT_DXT1A))
    goto LAB_001326fa;
  }
  else if ((int)pVar3 < 0x41787878) {
    if (((pVar3 == PIXEL_FMT_ETC2A) || (pVar3 == PIXEL_FMT_A8R8G8B8)) || (pVar3 == PIXEL_FMT_A8L8))
    goto LAB_001326fa;
  }
  else if (((pVar3 == PIXEL_FMT_A8) || (pVar3 == PIXEL_FMT_DXT5_AGBR)) ||
          (pVar3 == PIXEL_FMT_ETC2AS)) goto LAB_001326fa;
  conv_type = cConversion_Y_To_A;
LAB_001326fa:
  (state->m_qdxt1_params).m_num_mips = 0;
  state->m_qdxt5_params[0].m_num_mips = 0;
  state->m_qdxt5_params[1].m_num_mips = 0;
  if ((this->m_faces).m_size != 0) {
    uVar24 = 0;
    do {
      uVar23 = 0;
      while( true ) {
        if ((this->m_faces).m_size == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (ulong)((this->m_faces).m_p)->m_size;
        }
        if (uVar7 <= uVar23) break;
        this_00 = (this->m_faces).m_p[uVar24].m_p[uVar23];
        (dst_tex->m_faces).m_p[uVar24].m_p[uVar23]->m_orient_flags = this_00->m_orient_flags;
        tmp_img.m_width = 0;
        tmp_img.m_height = 0;
        tmp_img.m_pitch = 0;
        tmp_img.m_total = 0;
        tmp_img.m_comp_flags = 0xf;
        tmp_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
        tmp_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
        tmp_img.m_pixel_buf.m_size = 0;
        tmp_img.m_pixel_buf.m_capacity = 0;
        other = mip_level::get_unpacked_image(this_00,&tmp_img,1);
        image<crnlib::color_quad<unsigned_char,_int>_>::image(&img,other);
        if (conv_type != cConversion_Invalid) {
          image_utils::convert_image(&img,conv_type);
        }
        uVar21 = img.m_width + 3;
        uVar22 = uVar21 >> 2;
        uVar16 = img.m_height + 3;
        uVar15 = uVar16 >> 2;
        iVar6 = uVar15 * uVar22;
        uVar5 = (state->m_pixel_blocks).m_size;
        if (iVar6 != 0) {
          uVar19 = iVar6 + uVar5;
          if ((uVar5 <= uVar19) && ((state->m_pixel_blocks).m_capacity < uVar19)) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&state->m_pixel_blocks,uVar19,iVar6 == 1,0x40,
                       (object_mover)0x0,false);
          }
          (state->m_pixel_blocks).m_size = uVar19;
        }
        pdVar4 = (state->m_pixel_blocks).m_p;
        uVar19 = (state->m_qdxt1_params).m_num_mips;
        (state->m_qdxt1_params).m_mip_desc[uVar19].m_first_block = uVar5;
        (state->m_qdxt1_params).m_mip_desc[uVar19].m_block_width = uVar22;
        (state->m_qdxt1_params).m_mip_desc[uVar19].m_block_height = uVar15;
        (state->m_qdxt1_params).m_num_mips = uVar19 + 1;
        lVar11 = 1;
        puVar12 = &state->m_qdxt5_params[0].m_num_mips;
        do {
          uVar19 = *puVar12;
          uVar7 = (ulong)uVar19;
          puVar12[uVar7 * 3 + 1] = uVar5;
          puVar12[uVar7 * 3 + 2] = uVar22;
          puVar12[uVar7 * 3 + 3] = uVar15;
          *puVar12 = uVar19 + 1;
          puVar12 = puVar12 + 0x18c;
          lVar11 = lVar11 + -1;
        } while (lVar11 == 0);
        if (3 < uVar16) {
          pcVar8 = (color_quad_u8 *)(pdVar4 + uVar5);
          uVar5 = 0;
          do {
            if (3 < uVar21) {
              iVar6 = 0;
              uVar16 = 0;
              do {
                uVar19 = 0;
                pcVar18 = pcVar8;
                do {
                  uVar17 = uVar19 | uVar5 * 4;
                  iVar20 = 0;
                  do {
                    iVar13 = img.m_width - 1;
                    if (iVar6 + iVar20 < (int)(img.m_width - 1)) {
                      iVar13 = iVar6 + iVar20;
                    }
                    if ((int)(uVar16 * 4) < 0) {
                      iVar13 = 0;
                    }
                    uVar14 = img.m_height - 1;
                    if ((int)uVar17 < (int)(img.m_height - 1)) {
                      uVar14 = uVar17;
                    }
                    if ((int)(uVar5 * 4) < 0) {
                      uVar14 = 0;
                    }
                    uVar14 = uVar14 * img.m_pitch + iVar13;
                    (((color_quad_u8 *)&(pcVar18->field_0).field_0.r)->field_0).field_0.r =
                         img.m_pPixels[uVar14].field_0.field_0.r;
                    (pcVar18->field_0).field_0.g = img.m_pPixels[uVar14].field_0.field_0.g;
                    (pcVar18->field_0).field_0.b = img.m_pPixels[uVar14].field_0.field_0.b;
                    (pcVar18->field_0).field_0.a = img.m_pPixels[uVar14].field_0.field_0.a;
                    pcVar18 = pcVar18 + 1;
                    iVar20 = iVar20 + 1;
                  } while (iVar20 != 4);
                  uVar19 = uVar19 + 1;
                } while (uVar19 != 4);
                pcVar8 = pcVar8 + 0x10;
                uVar16 = uVar16 + 1;
                iVar6 = iVar6 + 4;
              } while (uVar16 != uVar22);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar15);
        }
        if (img.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(img.m_pixel_buf.m_p);
        }
        if (tmp_img.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(tmp_img.m_pixel_buf.m_p);
        }
        uVar23 = uVar23 + 1;
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < (this->m_faces).m_size);
  }
  if ((((state->m_has_blocks[0] == false) ||
       (iVar6 = qdxt1::init(&state->m_qdxt1,(EVP_PKEY_CTX *)(ulong)(state->m_pixel_blocks).m_size),
       (char)iVar6 != '\0')) &&
      ((state->m_has_blocks[1] != true ||
       (iVar6 = qdxt5::init(&state->m_qdxt5a,(EVP_PKEY_CTX *)(ulong)(state->m_pixel_blocks).m_size),
       (char)iVar6 != '\0')))) &&
     ((state->m_has_blocks[2] != true ||
      (iVar6 = qdxt5::init(&state->m_qdxt5b,(EVP_PKEY_CTX *)(ulong)(state->m_pixel_blocks).m_size),
      (char)iVar6 != '\0')))) {
    return true;
  }
  return false;
}

Assistant:

bool mipmapped_texture::qdxt_pack_init(qdxt_state& state, mipmapped_texture& dst_tex, const qdxt1_params& dxt1_params, const qdxt5_params& dxt5_params, pixel_format fmt, bool cook) {
  if (!is_valid())
    return false;

  state.m_qdxt1_params = dxt1_params;
  state.m_qdxt5_params[0] = dxt5_params;
  state.m_qdxt5_params[1] = dxt5_params;
  utils::zero_object(state.m_has_blocks);

  switch (fmt) {
    case PIXEL_FMT_DXT1: {
      state.m_has_blocks[0] = true;
      break;
    }
    case PIXEL_FMT_DXT1A: {
      state.m_has_blocks[0] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = true;
      break;
    }
    case PIXEL_FMT_DXT4:
    case PIXEL_FMT_DXT5: {
      state.m_has_blocks[0] = true;
      state.m_has_blocks[1] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = false;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_DXT5_CCxY:
    case PIXEL_FMT_DXT5_xGxR:
    case PIXEL_FMT_DXT5_xGBR:
    case PIXEL_FMT_DXT5_AGBR: {
      state.m_has_blocks[0] = true;
      state.m_has_blocks[1] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = false;
      state.m_qdxt1_params.m_perceptual = false;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_3DC: {
      state.m_has_blocks[1] = true;
      state.m_has_blocks[2] = true;
      state.m_qdxt5_params[0].m_comp_index = 1;
      state.m_qdxt5_params[1].m_comp_index = 0;
      break;
    }
    case PIXEL_FMT_DXN: {
      state.m_has_blocks[1] = true;
      state.m_has_blocks[2] = true;
      state.m_qdxt5_params[0].m_comp_index = 0;
      state.m_qdxt5_params[1].m_comp_index = 1;
      break;
    }
    case PIXEL_FMT_DXT5A: {
      state.m_has_blocks[1] = true;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_ETC1:
    case PIXEL_FMT_ETC2:
    case PIXEL_FMT_ETC2A:
    case PIXEL_FMT_ETC1S:
    case PIXEL_FMT_ETC2AS: {
      console::warning("mipmapped_texture::qdxt_pack_init: This method does not support ETCn");
      return false;
    }
    default: {
      CRNLIB_ASSERT(0);
      return false;
    }
  }

  const uint num_elements = state.m_has_blocks[0] + state.m_has_blocks[1] + state.m_has_blocks[2];

  uint cur_progress_start = dxt1_params.m_progress_start;
  if (state.m_has_blocks[0]) {
    state.m_qdxt1_params.m_progress_start = cur_progress_start;
    state.m_qdxt1_params.m_progress_range = dxt1_params.m_progress_range / num_elements;
    cur_progress_start += state.m_qdxt1_params.m_progress_range;
  }

  if (state.m_has_blocks[1]) {
    state.m_qdxt5_params[0].m_progress_start = cur_progress_start;
    state.m_qdxt5_params[0].m_progress_range = dxt1_params.m_progress_range / num_elements;
    cur_progress_start += state.m_qdxt5_params[0].m_progress_range;
  }

  if (state.m_has_blocks[2]) {
    state.m_qdxt5_params[1].m_progress_start = cur_progress_start;
    state.m_qdxt5_params[1].m_progress_range = dxt1_params.m_progress_range - cur_progress_start;
  }

  state.m_fmt = fmt;

  dst_tex.init(get_width(), get_height(), get_num_levels(), get_num_faces(), fmt, get_name().get_ptr(), cDefaultOrientationFlags);

  state.m_pixel_blocks.resize(0);

  image_utils::conversion_type cook_conv_type = image_utils::cConversion_Invalid;
  if (cook) {
    cook_conv_type = image_utils::get_conversion_type(true, fmt);
    if (pixel_format_helpers::is_alpha_only(fmt) && !pixel_format_helpers::has_alpha(m_format))
      cook_conv_type = image_utils::cConversion_Y_To_A;
  }

  state.m_qdxt1_params.m_num_mips = 0;
  state.m_qdxt5_params[0].m_num_mips = 0;
  state.m_qdxt5_params[1].m_num_mips = 0;

  for (uint f = 0; f < get_num_faces(); f++) {
    for (uint l = 0; l < get_num_levels(); l++) {
      mip_level* pLevel = get_level(f, l);

      dst_tex.get_level(f, l)->set_orientation_flags(pLevel->get_orientation_flags());

      image_u8 tmp_img;
      image_u8 img(*pLevel->get_unpacked_image(tmp_img, cUnpackFlagUncook));

      if (cook_conv_type != image_utils::cConversion_Invalid)
        image_utils::convert_image(img, cook_conv_type);

      const uint num_blocks_x = (img.get_width() + 3) / 4;
      const uint num_blocks_y = (img.get_height() + 3) / 4;
      const uint total_blocks = num_blocks_x * num_blocks_y;

      const uint cur_size = state.m_pixel_blocks.size();
      state.m_pixel_blocks.resize(cur_size + total_blocks);
      dxt_pixel_block* pDst_blocks = &state.m_pixel_blocks[cur_size];

      {
        CRNLIB_ASSERT(state.m_qdxt1_params.m_num_mips < qdxt1_params::cMaxMips);
        qdxt1_params::mip_desc& mip_desc = state.m_qdxt1_params.m_mip_desc[state.m_qdxt1_params.m_num_mips];
        mip_desc.m_first_block = cur_size;
        mip_desc.m_block_width = num_blocks_x;
        mip_desc.m_block_height = num_blocks_y;
        state.m_qdxt1_params.m_num_mips++;
      }

      for (uint i = 0; i < 2; i++) {
        CRNLIB_ASSERT(state.m_qdxt5_params[i].m_num_mips < qdxt5_params::cMaxMips);
        qdxt5_params::mip_desc& mip_desc = state.m_qdxt5_params[i].m_mip_desc[state.m_qdxt5_params[i].m_num_mips];
        mip_desc.m_first_block = cur_size;
        mip_desc.m_block_width = num_blocks_x;
        mip_desc.m_block_height = num_blocks_y;
        state.m_qdxt5_params[i].m_num_mips++;
      }

      for (uint block_y = 0; block_y < num_blocks_y; block_y++) {
        const uint img_y = block_y << 2;

        for (uint block_x = 0; block_x < num_blocks_x; block_x++) {
          const uint img_x = block_x << 2;

          color_quad_u8* pDst_pixel = &pDst_blocks->m_pixels[0][0];

          pDst_blocks++;

          for (uint by = 0; by < 4; by++)
            for (uint bx = 0; bx < 4; bx++)
              *pDst_pixel++ = img.get_clamped(img_x + bx, img_y + by);
        }  // block_x
      }    // block_y
    }      // l
  }        // f

  if (state.m_has_blocks[0]) {
    if (!state.m_qdxt1.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt1_params))
      return false;
  }

  if (state.m_has_blocks[1]) {
    if (!state.m_qdxt5a.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt5_params[0]))
      return false;
  }

  if (state.m_has_blocks[2]) {
    if (!state.m_qdxt5b.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt5_params[1]))
      return false;
  }

  return true;
}